

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
          (InternalMetadataWithArenaLite *this,string *other)

{
  string *other_local;
  InternalMetadataWithArenaLite *this_local;
  Container *local_20;
  
  if (((uint)(this->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_20 = InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                         ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                           *)this);
  }
  else {
    local_20 = (Container *)
               InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ::mutable_unknown_fields_slow
                         (&this->
                           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                         );
  }
  std::__cxx11::string::append((string *)local_20);
  return;
}

Assistant:

void DoMergeFrom(const string& other) {
    mutable_unknown_fields()->append(other);
  }